

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

void __thiscall RenX::Server::setPrefix(Server *this,string_view prefix)

{
  string tagged_prefix;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,prefix._M_str,prefix._M_str + prefix._M_len);
  sanitizeTags(&local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->m_IRCPrefix,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RenX::Server::setPrefix(std::string_view prefix) {
	// TODO: pass in std::string here instead
	std::string tagged_prefix = static_cast<std::string>(prefix);
	RenX::sanitizeTags(tagged_prefix);
	m_IRCPrefix = tagged_prefix;
}